

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

int longOptionStrcmp(poptOption *opt,char *longName,size_t longNameLen)

{
  int iVar1;
  char *pcVar2;
  uint local_34;
  char *pcStack_30;
  int rc;
  char *optLongName;
  size_t longNameLen_local;
  char *longName_local;
  poptOption *opt_local;
  
  pcVar2 = opt->longName;
  if ((pcVar2 == (char *)0x0) || (longName == (char *)0x0)) {
    opt_local._4_4_ = 0;
  }
  else {
    pcStack_30 = pcVar2;
    optLongName = (char *)longNameLen;
    longNameLen_local = (size_t)longName;
    if ((opt->argInfo & 0x200000) != 0) {
      if (((*pcVar2 == 'n') && (pcVar2[1] == 'o')) && (pcStack_30 = pcVar2 + 2, *pcStack_30 == '-'))
      {
        pcStack_30 = pcVar2 + 3;
      }
      if ((*longName == 'n') && (longName[1] == 'o')) {
        longNameLen_local = (size_t)(longName + 2);
        optLongName = (char *)(longNameLen - 2);
        if (*(char *)longNameLen_local == '-') {
          longNameLen_local = (size_t)(longName + 3);
          optLongName = (char *)(longNameLen - 3);
        }
      }
    }
    pcVar2 = (char *)strlen(pcStack_30);
    local_34 = (uint)(pcVar2 == optLongName);
    if (local_34 != 0) {
      iVar1 = strncmp(pcStack_30,(char *)longNameLen_local,(size_t)optLongName);
      local_34 = (uint)(iVar1 == 0);
    }
    opt_local._4_4_ = local_34;
  }
  return opt_local._4_4_;
}

Assistant:

static int
longOptionStrcmp(const struct poptOption * opt,
		const char * longName, size_t longNameLen)
{
    const char * optLongName = opt->longName;
    int rc;

    if (optLongName == NULL || longName == NULL)	/* XXX can't happen */
	return 0;

    if (F_ISSET(opt, TOGGLE)) {
	if (optLongName[0] == 'n' && optLongName[1] == 'o') {
	    optLongName += sizeof("no") - 1;
	    if (optLongName[0] == '-')
		optLongName++;
	}
	if (longName[0] == 'n' && longName[1] == 'o') {
	    longName += sizeof("no") - 1;
	    longNameLen -= sizeof("no") - 1;
	    if (longName[0] == '-') {
		longName++;
		longNameLen--;
	    }
	}
    }
    rc = (int)(strlen(optLongName) == longNameLen);
    if (rc)
	rc = (int)(strncmp(optLongName, longName, longNameLen) == 0);
    return rc;
}